

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

uint32 google::protobuf::io::AssembleUTF16(uint32 head_surrogate,uint32 trail_surrogate)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogFinisher local_9a;
  byte local_99;
  LogMessage local_98;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  uint32 local_10;
  uint32 local_c;
  uint32 trail_surrogate_local;
  uint32 head_surrogate_local;
  
  local_10 = trail_surrogate;
  local_c = head_surrogate;
  bVar1 = IsHeadSurrogate(head_surrogate);
  local_49 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x3e2);
    local_49 = 1;
    pLVar2 = internal::LogMessage::operator<<
                       (&local_48,"CHECK failed: IsHeadSurrogate(head_surrogate): ");
    internal::LogFinisher::operator=(local_5d,pLVar2);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  bVar1 = IsTrailSurrogate(local_10);
  local_99 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x3e3);
    local_99 = 1;
    pLVar2 = internal::LogMessage::operator<<
                       (&local_98,"CHECK failed: IsTrailSurrogate(trail_surrogate): ");
    internal::LogFinisher::operator=(&local_9a,pLVar2);
  }
  if ((local_99 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_98);
  }
  return ((local_c - 0xd800) * 0x400 | local_10 - 0xdc00) + 0x10000;
}

Assistant:

static uint32 AssembleUTF16(uint32 head_surrogate, uint32 trail_surrogate) {
  GOOGLE_DCHECK(IsHeadSurrogate(head_surrogate));
  GOOGLE_DCHECK(IsTrailSurrogate(trail_surrogate));
  return 0x10000 + (((head_surrogate - kMinHeadSurrogate) << 10) |
      (trail_surrogate - kMinTrailSurrogate));
}